

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O1

void __thiscall efsw::DirWatcherGeneric::watch(DirWatcherGeneric *this,bool reportOwnChange)

{
  WatchID WVar1;
  FileWatchListener *pFVar2;
  pointer pcVar3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  _Self __tmp;
  _List_node_base *p_Var6;
  undefined7 in_register_00000031;
  _Self __tmp_2;
  _Self __tmp_1;
  DirectorySnapshotDiff *pDVar7;
  char *__end;
  DirectorySnapshotDiff Diff;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  long *local_198 [2];
  long local_188 [2];
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  DirectorySnapshotDiff local_f8;
  
  DirectorySnapshot::scan(&local_f8,&this->DirSnap);
  if ((((int)CONCAT71(in_register_00000031,reportOwnChange) != 0) && (local_f8.DirChanged == true))
     && (this->Parent != (DirWatcherGeneric *)0x0)) {
    WVar1 = (this->Watch->super_Watcher).ID;
    pFVar2 = (this->Watch->super_Watcher).Listener;
    pcVar3 = (this->DirSnap).DirectoryInfo.Filepath._M_dataplus._M_p;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar3,
               pcVar3 + (this->DirSnap).DirectoryInfo.Filepath._M_string_length);
    FileSystem::pathRemoveFileName(&local_118,&local_158);
    pcVar3 = (this->DirSnap).DirectoryInfo.Filepath._M_dataplus._M_p;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar3,
               pcVar3 + (this->DirSnap).DirectoryInfo.Filepath._M_string_length);
    FileSystem::fileNameFromPath(&local_138,&local_178);
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
    (*pFVar2->_vptr_FileWatchListener[2])(pFVar2,WVar1,&local_118,&local_138,3,local_198);
    if (local_198[0] != local_188) {
      operator_delete(local_198[0],local_188[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = DirectorySnapshotDiff::changed(&local_f8);
  if (bVar4) {
    if (local_f8.FilesCreated.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.FilesCreated)
    {
      p_Var6 = local_f8.FilesCreated.
               super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
               super__List_node_base._M_next;
      do {
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"","");
        handleAction(this,(string *)(p_Var6 + 1),1,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)&local_f8.FilesCreated);
    }
    if (local_f8.FilesModified.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.FilesModified)
    {
      p_Var6 = local_f8.FilesModified.
               super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
               super__List_node_base._M_next;
      do {
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"","");
        handleAction(this,(string *)(p_Var6 + 1),3,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)&local_f8.FilesModified);
    }
    if ((DirectorySnapshotDiff *)
        local_f8.FilesDeleted.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl._M_node.super__List_node_base._M_next != &local_f8) {
      pDVar7 = (DirectorySnapshotDiff *)
               local_f8.FilesDeleted.
               super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
               super__List_node_base._M_next;
      do {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"","");
        handleAction(this,(string *)
                          &(pDVar7->FilesDeleted).
                           super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl
                           ._M_node._M_size,2,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        pDVar7 = (DirectorySnapshotDiff *)
                 (pDVar7->FilesDeleted).
                 super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
                 super__List_node_base._M_next;
      } while (pDVar7 != &local_f8);
    }
    if (local_f8.FilesMoved.
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.FilesMoved) {
      p_Var6 = local_f8.FilesMoved.
               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      do {
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,p_Var6[1]._M_next,
                   (long)&(p_Var6[1]._M_prev)->_M_next + (long)p_Var6[1]._M_next);
        handleAction(this,(string *)(p_Var6 + 3),4,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)&local_f8.FilesMoved);
    }
    if (local_f8.DirsCreated.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.DirsCreated) {
      p_Var6 = local_f8.DirsCreated.
               super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
               super__List_node_base._M_next;
      do {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,p_Var6[1]._M_next,
                   (long)&(p_Var6[1]._M_prev)->_M_next + (long)p_Var6[1]._M_next);
        createDirectory(this,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)&local_f8.DirsCreated);
    }
    if (local_f8.DirsModified.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.DirsModified)
    {
      p_Var6 = local_f8.DirsModified.
               super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
               super__List_node_base._M_next;
      do {
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"","");
        handleAction(this,(string *)(p_Var6 + 1),3,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)&local_f8.DirsModified);
    }
    if (local_f8.DirsDeleted.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.DirsDeleted) {
      p_Var6 = local_f8.DirsDeleted.
               super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>._M_impl._M_node.
               super__List_node_base._M_next;
      do {
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"","");
        handleAction(this,(string *)(p_Var6 + 1),2,&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,p_Var6[1]._M_next,
                   (long)&(p_Var6[1]._M_prev)->_M_next + (long)p_Var6[1]._M_next);
        removeDirectory(this,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)&local_f8.DirsDeleted);
    }
    if (local_f8.DirsMoved.
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_f8.DirsMoved) {
      p_Var6 = local_f8.DirsMoved.
               super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      do {
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,p_Var6[1]._M_next,
                   (long)&(p_Var6[1]._M_prev)->_M_next + (long)p_Var6[1]._M_next);
        handleAction(this,(string *)(p_Var6 + 3),4,&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,p_Var6[1]._M_next,
                   (long)&(p_Var6[1]._M_prev)->_M_next + (long)p_Var6[1]._M_next);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,p_Var6[3]._M_next,
                   (long)&(p_Var6[3]._M_prev)->_M_next + (long)p_Var6[3]._M_next);
        moveDirectory(this,&local_2f8,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = p_Var6->_M_next;
      } while (p_Var6 != (_List_node_base *)&local_f8.DirsMoved);
    }
  }
  for (p_Var5 = (this->Directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(this->Directories)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    watch(*(DirWatcherGeneric **)(p_Var5 + 2),false);
  }
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::_M_clear(&local_f8.DirsMoved.
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            );
  std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
            (&local_f8.DirsModified.
              super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
  std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
            (&local_f8.DirsCreated.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>
            );
  std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
            (&local_f8.DirsDeleted.super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>
            );
  std::__cxx11::
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::_M_clear(&local_f8.FilesMoved.
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
            );
  std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
            (&local_f8.FilesModified.
              super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
  std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
            (&local_f8.FilesCreated.
              super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>);
  std::__cxx11::_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>::_M_clear
            ((_List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_> *)&local_f8);
  return;
}

Assistant:

void DirWatcherGeneric::watch( bool reportOwnChange )
{
	DirectorySnapshotDiff Diff = DirSnap.scan();

	if ( reportOwnChange && Diff.DirChanged && NULL != Parent )
	{
		Watch->Listener->handleFileAction( Watch->ID, FileSystem::pathRemoveFileName( DirSnap.DirectoryInfo.Filepath ), FileSystem::fileNameFromPath( DirSnap.DirectoryInfo.Filepath ), Actions::Modified );
	}

	if ( Diff.changed() )
	{
		FileInfoList::iterator it;
		MovedList::iterator mit;

		/// Files
		DiffIterator( FilesCreated )
		{
			handleAction( (*it).Filepath, Actions::Add );
		}

		DiffIterator( FilesModified )
		{
			handleAction( (*it).Filepath, Actions::Modified );
		}

		DiffIterator( FilesDeleted )
		{
			handleAction( (*it).Filepath, Actions::Delete );
		}

		DiffMovedIterator( FilesMoved )
		{
			handleAction( (*mit).second.Filepath, Actions::Moved, (*mit).first );
		}

		/// Directories
		DiffIterator( DirsCreated )
		{
			createDirectory( (*it).Filepath );
		}

		DiffIterator( DirsModified )
		{
			handleAction( (*it).Filepath, Actions::Modified );
		}

		DiffIterator( DirsDeleted )
		{
			handleAction( (*it).Filepath, Actions::Delete );
			removeDirectory( (*it).Filepath );
		}

		DiffMovedIterator( DirsMoved )
		{
			handleAction( (*mit).second.Filepath, Actions::Moved, (*mit).first );
			moveDirectory( (*mit).first, (*mit).second.Filepath );
		}
	}

	/// Process the subdirectories looking for changes
	for ( DirWatchMap::iterator dit = Directories.begin(); dit != Directories.end(); dit++ )
	{
		/// Just watch
		dit->second->watch();
	}
}